

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ValidateEnum(Parser *this,EnumDescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar5;
  int index;
  undefined1 *puVar6;
  int i;
  int index_00;
  ErrorMaker error;
  ErrorMaker error_00;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  used_values;
  int32_t local_c4;
  Parser *local_c0;
  iterator local_b8;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
  local_a8;
  undefined1 local_90 [96];
  
  index = 0;
  local_c0 = this;
  do {
    puVar6 = (undefined1 *)(proto->field_0)._impl_.options_;
    if ((EnumOptions *)puVar6 == (EnumOptions *)0x0) {
      puVar6 = _EnumOptions_default_instance_;
    }
    iVar2 = *(int *)((long)&((EnumOptions *)puVar6)->field_0 + 0x28);
    if (iVar2 <= index) goto LAB_001badd1;
    from = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                     (&(((EnumOptions *)puVar6)->field_0)._impl_.uninterpreted_option_.
                       super_RepeatedPtrFieldBase,index);
    UninterpretedOption::UninterpretedOption((UninterpretedOption *)local_90,from);
    if ((int)local_90._32_4_ < 2) {
      pVVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                         ((RepeatedPtrFieldBase *)(local_90 + 0x18),0);
      if ((pVVar4->field_0)._impl_.is_extension_ == false) {
        pVVar4 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                           ((RepeatedPtrFieldBase *)(local_90 + 0x18),0);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(pVVar4->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc),"allow_alias");
        if (bVar3) break;
      }
    }
    UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_90);
    index = index + 1;
  } while( true );
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_90._48_8_ & 0xfffffffffffffffc),"true");
  UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_90);
  if (bVar3) {
LAB_001badd1:
    local_90._0_8_ = (_func_int **)0x1;
    local_90._8_8_ = 0;
    for (index_00 = 0; iVar1 = *(int *)((long)&proto->field_0 + 0x10), index_00 < iVar1;
        index_00 = index_00 + 1) {
      pVVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                         (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,index_00);
      local_c4 = (pVVar5->field_0)._impl_.number_;
      local_a8.first =
           absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
           ::find<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)local_90,&local_c4);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *)local_90);
      local_b8.ctrl_ = (ctrl_t *)0x0;
      bVar3 = absl::lts_20250127::container_internal::operator!=(&local_a8.first,&local_b8);
      if (bVar3) {
        bVar3 = true;
        goto LAB_001bae8c;
      }
      local_b8.ctrl_ = (ctrl_t *)CONCAT44(local_b8.ctrl_._4_4_,(pVVar5->field_0)._impl_.number_);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::emplace<int,_0>(&local_a8,
                        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)local_90,(int *)&local_b8);
    }
    bVar3 = true;
    if ((iVar1 <= index_00) && (index < iVar2)) {
      error.func_ = ErrorMaker::
                    ErrorMaker<google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_1,void>(google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_1)
                    ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
      error.field_0.error_ = (char *)proto;
      RecordError(local_c0,error);
      bVar3 = false;
    }
LAB_001bae8c:
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     *)local_90);
  }
  else {
    error_00.func_ =
         ErrorMaker::
         ErrorMaker<google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_0,void>(google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::$_0)
         ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
    error_00.field_0.error_ = (char *)proto;
    RecordError(local_c0,error_00);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Parser::ValidateEnum(const EnumDescriptorProto* proto) {
  bool has_allow_alias = false;
  bool allow_alias = false;

  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption option = proto->options().uninterpreted_option(i);
    if (option.name_size() > 1) {
      continue;
    }
    if (!option.name(0).is_extension() &&
        option.name(0).name_part() == "allow_alias") {
      has_allow_alias = true;
      if (option.identifier_value() == "true") {
        allow_alias = true;
      }
      break;
    }
  }

  if (has_allow_alias && !allow_alias) {
    // This needlessly clutters declarations with nops.
    RecordError([=] {
      return absl::StrCat(
          "\"", proto->name(),
          "\" declares 'option allow_alias = false;' which has no effect. "
          "Please remove the declaration.");
    });
    return false;
  }

  absl::flat_hash_set<int> used_values;
  bool has_duplicates = false;
  for (int i = 0; i < proto->value_size(); ++i) {
    const EnumValueDescriptorProto& enum_value = proto->value(i);
    if (used_values.find(enum_value.number()) != used_values.end()) {
      has_duplicates = true;
      break;
    } else {
      used_values.insert(enum_value.number());
    }
  }
  if (allow_alias && !has_duplicates) {
    // Generate an error if an enum declares support for duplicate enum values
    // and does not use it protect future authors.
    RecordError([=] {
      return absl::StrCat(
          "\"", proto->name(),
          "\" declares support for enum aliases but no enum values share field "
          "numbers. Please remove the unnecessary 'option allow_alias = true;' "
          "declaration.");
    });
    return false;
  }

  return true;
}